

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  void **ppvVar1;
  uint uVar2;
  int *__s;
  long ***ppplVar3;
  ssize_t sVar4;
  char *pcVar5;
  long ****pppplVar6;
  int *piVar7;
  int *piVar8;
  watcher_list *w;
  char buf [4096];
  long ***local_1058;
  long **local_1050;
  uv_loop_t *local_1048;
  int *local_1040;
  int local_1038 [1026];
  
  local_1048 = loop;
  do {
    while (sVar4 = read(loop->inotify_fd,local_1038,0x1000), sVar4 == -1) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        if (*piVar7 != 0xb) {
          __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                        ,0xd6,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
        }
        return;
      }
    }
    if (sVar4 < 1) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-inotify.c"
                    ,0xda,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    local_1040 = (int *)((long)local_1038 + sVar4);
    piVar7 = local_1038;
    do {
      uVar2 = piVar7[1];
      w = (watcher_list *)loop->inotify_watchers;
      if (w != (watcher_list *)0x0) {
        do {
          if (w->wd <= *piVar7) {
            if (*piVar7 <= w->wd) goto LAB_0054a4e0;
            w = (watcher_list *)&(w->entry).rbe_right;
          }
          w = (w->entry).rbe_left;
        } while (w != (watcher_list *)0x0);
      }
      w = (watcher_list *)0x0;
LAB_0054a4e0:
      if (w != (watcher_list *)0x0) {
        if (piVar7[3] == 0) {
          __s = (int *)w->path;
          pcVar5 = strrchr((char *)__s,0x2f);
          piVar8 = (int *)(pcVar5 + 1);
          if (pcVar5 == (char *)0x0) {
            piVar8 = __s;
          }
        }
        else {
          piVar8 = piVar7 + 4;
        }
        w->iterating = 1;
        ppvVar1 = w->watchers;
        local_1058 = (long ***)w->watchers[0];
        if ((long ***)ppvVar1 == local_1058) {
          pppplVar6 = (long ****)&local_1050;
          local_1058 = (long ***)&local_1058;
        }
        else {
          local_1050 = (long **)w->watchers[1];
          *local_1050 = (long *)&local_1058;
          ppplVar3 = ((long ****)local_1058)[1];
          pppplVar6 = (long ****)local_1058 + 1;
          w->watchers[1] = ppplVar3;
          *ppplVar3 = (long **)ppvVar1;
        }
        *pppplVar6 = (long ***)&local_1058;
        if (&local_1058 != (long ****)local_1058) {
          do {
            *local_1058[1] = (long *)*local_1058;
            (*local_1058)[1] = (long *)local_1058[1];
            *local_1058 = (long **)ppvVar1;
            ppplVar3 = (long ***)w->watchers[1];
            local_1058[1] = (long **)ppplVar3;
            *ppplVar3 = (long **)local_1058;
            w->watchers[1] = local_1058;
            (*(code *)local_1058[-1])
                      (local_1058 + -0xe,piVar8,
                       ((uVar2 & 0xfffffff9) != 0) + ((uVar2 & 6) != 0) * '\x02',0);
          } while (&local_1058 != (long ****)local_1058);
        }
        loop = local_1048;
        w->iterating = 0;
        maybe_free_watcher_list(w,local_1048);
      }
      piVar7 = (int *)((long)piVar7 + (ulong)(uint)piVar7[3] + 0x10);
    } while (piVar7 < local_1040);
  } while( true );
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct uv__inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  QUEUE queue;
  QUEUE* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  while (1) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct uv__inotify_event*)p;

      events = 0;
      if (e->mask & (UV__IN_ATTRIB|UV__IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(UV__IN_ATTRIB|UV__IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use QUEUE_MOVE() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      QUEUE_MOVE(&w->watchers, &queue);
      while (!QUEUE_EMPTY(&queue)) {
        q = QUEUE_HEAD(&queue);
        h = QUEUE_DATA(q, uv_fs_event_t, watchers);

        QUEUE_REMOVE(q);
        QUEUE_INSERT_TAIL(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}